

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O2

int BN_mask_bits(BIGNUM *a,int n)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = 0;
  if (-1 < n) {
    uVar3 = (uint)n >> 6;
    uVar1 = (ulong)uVar3;
    if ((int)uVar3 < a->top) {
      if ((n & 0x3fU) != 0) {
        uVar3 = uVar3 + 1;
        a->d[uVar1] = a->d[uVar1] & ~(-1L << (sbyte)(n & 0x3fU));
      }
      a->top = uVar3;
      bn_correct_top((BIGNUM *)a);
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int BN_mask_bits(BIGNUM *a, int n)
{
    int b, w;

    bn_check_top(a);
    if (n < 0)
        return 0;

    w = n / BN_BITS2;
    b = n % BN_BITS2;
    if (w >= a->top)
        return 0;
    if (b == 0)
        a->top = w;
    else {
        a->top = w + 1;
        a->d[w] &= ~(BN_MASK2 << b);
    }
    bn_correct_top(a);
    return (1);
}